

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_function_expression.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundFunctionExpression::Copy(BoundFunctionExpression *this)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  long lVar2;
  _Head_base<0UL,_duckdb::BoundFunctionExpression_*,_false> _Var3;
  pointer pEVar4;
  pointer pFVar5;
  pointer this_00;
  pointer *__ptr;
  Expression *in_RSI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> new_bind_info;
  templated_unique_single_t copy;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  new_children;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_58;
  _Head_base<0UL,_duckdb::BoundFunctionExpression_*,_false> local_50;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_48;
  
  local_48.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_48,
            (long)(*(long *)((long)&in_RSI[4].super_BaseExpression.alias.field_2 + 8) -
                  in_RSI[4].super_BaseExpression.alias.field_2._M_allocated_capacity) >> 3);
  this_01 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
            in_RSI[4].super_BaseExpression.alias.field_2._M_allocated_capacity;
  puVar1 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
            ((long)&in_RSI[4].super_BaseExpression.alias.field_2 + 8);
  if (this_01 != puVar1) {
    do {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_58,pEVar4);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_48,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_58);
      if (local_58._M_head_impl != (Expression *)0x0) {
        (*((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      this_01 = this_01 + 1;
    } while (this_01 != puVar1);
  }
  lVar2._0_1_ = in_RSI[4].return_type.id_;
  lVar2._1_1_ = in_RSI[4].return_type.physical_type_;
  lVar2._2_6_ = *(undefined6 *)&in_RSI[4].return_type.field_0x2;
  if (lVar2 == 0) {
    local_58._M_head_impl = (Expression *)0x0;
  }
  else {
    pFVar5 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                         *)&in_RSI[4].return_type);
    (*pFVar5->_vptr_FunctionData[2])(&local_58,pFVar5);
  }
  make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType_const&,duckdb::ScalarFunction_const&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,bool_const&>
            ((duckdb *)&local_50,&in_RSI->return_type,(ScalarFunction *)(in_RSI + 1),&local_48,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             &local_58,(bool *)&in_RSI[4].return_type.type_info_);
  this_00 = unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                          *)&local_50);
  Expression::CopyProperties(&this_00->super_Expression,in_RSI);
  _Var3._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (BoundFunctionExpression *)0x0;
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)_Var3._M_head_impl;
  if (local_58._M_head_impl != (Expression *)0x0) {
    (*((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_48);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundFunctionExpression::Copy() const {
	vector<unique_ptr<Expression>> new_children;
	new_children.reserve(children.size());
	for (auto &child : children) {
		new_children.push_back(child->Copy());
	}
	unique_ptr<FunctionData> new_bind_info = bind_info ? bind_info->Copy() : nullptr;

	auto copy = make_uniq<BoundFunctionExpression>(return_type, function, std::move(new_children),
	                                               std::move(new_bind_info), is_operator);
	copy->CopyProperties(*this);
	return std::move(copy);
}